

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_writeEpilogue(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity)

{
  uint uVar1;
  size_t code;
  XXH64_hash_t XVar2;
  U32 checksum;
  U32 cBlockHeader24;
  size_t fhSize;
  BYTE *op;
  BYTE *ostart;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  if (cctx->stage == ZSTDcs_created) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  else {
    fhSize = (size_t)dst;
    ostart = (BYTE *)dstCapacity;
    if (cctx->stage == ZSTDcs_init) {
      code = ZSTD_writeFrameHeader(dst,dstCapacity,cctx->appliedParams,0,0);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        return code;
      }
      ostart = (BYTE *)(dstCapacity - code);
      fhSize = code + (long)dst;
      cctx->stage = ZSTDcs_ongoing;
    }
    if (cctx->stage != ZSTDcs_ending) {
      if (ostart < (BYTE *)0x4) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE32((void *)fhSize,1);
      fhSize = fhSize + 3;
      ostart = ostart + -3;
    }
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XVar2 = XXH64_digest(&cctx->xxhState);
      if (ostart < (BYTE *)0x4) {
        return 0xffffffffffffffba;
      }
      MEM_writeLE32((void *)fhSize,(U32)XVar2);
      fhSize = fhSize + 4;
    }
    cctx->stage = ZSTDcs_created;
    cctx_local = (ZSTD_CCtx *)(fhSize - (long)dst);
  }
  return (size_t)cctx_local;
}

Assistant:

static size_t ZSTD_writeEpilogue(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity)
{
    BYTE* const ostart = (BYTE*)dst;
    BYTE* op = ostart;
    size_t fhSize = 0;

    DEBUGLOG(4, "ZSTD_writeEpilogue");
    if (cctx->stage == ZSTDcs_created) return ERROR(stage_wrong);  /* init missing */

    /* special case : empty frame */
    if (cctx->stage == ZSTDcs_init) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams, 0, 0);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        op += fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (cctx->stage != ZSTDcs_ending) {
        /* write one last empty block, make it the "last" block */
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1) + 0;
        if (dstCapacity<4) return ERROR(dstSize_tooSmall);
        MEM_writeLE32(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
    }

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        if (dstCapacity<4) return ERROR(dstSize_tooSmall);
        DEBUGLOG(4, "ZSTD_writeEpilogue: write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32(op, checksum);
        op += 4;
    }

    cctx->stage = ZSTDcs_created;  /* return to "created but no init" status */
    return op-ostart;
}